

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathContextPtr xmlXPathNewContext(xmlDocPtr doc)

{
  xmlHashTablePtr pxVar1;
  xmlXPathContextPtr ret;
  xmlDocPtr doc_local;
  
  doc_local = (xmlDocPtr)(*xmlMalloc)(0x178);
  if ((xmlXPathContextPtr)doc_local == (xmlXPathContextPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating context\n");
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    memset(doc_local,0,0x178);
    ((xmlXPathContextPtr)doc_local)->doc = doc;
    ((xmlXPathContextPtr)doc_local)->node = (xmlNodePtr)0x0;
    ((xmlXPathContextPtr)doc_local)->varHash = (xmlHashTablePtr)0x0;
    ((xmlXPathContextPtr)doc_local)->nb_types = 0;
    ((xmlXPathContextPtr)doc_local)->max_types = 0;
    ((xmlXPathContextPtr)doc_local)->types = (xmlXPathTypePtr)0x0;
    pxVar1 = xmlHashCreate(0);
    ((xmlXPathContextPtr)doc_local)->funcHash = pxVar1;
    ((xmlXPathContextPtr)doc_local)->nb_axis = 0;
    ((xmlXPathContextPtr)doc_local)->max_axis = 0;
    ((xmlXPathContextPtr)doc_local)->axis = (xmlXPathAxisPtr)0x0;
    ((xmlXPathContextPtr)doc_local)->nsHash = (xmlHashTablePtr)0x0;
    ((xmlXPathContextPtr)doc_local)->user = (void *)0x0;
    ((xmlXPathContextPtr)doc_local)->contextSize = -1;
    ((xmlXPathContextPtr)doc_local)->proximityPosition = -1;
    xmlXPathRegisterAllFunctions((xmlXPathContextPtr)doc_local);
  }
  return (xmlXPathContextPtr)doc_local;
}

Assistant:

xmlXPathContextPtr
xmlXPathNewContext(xmlDocPtr doc) {
    xmlXPathContextPtr ret;

    ret = (xmlXPathContextPtr) xmlMalloc(sizeof(xmlXPathContext));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "creating context\n");
	return(NULL);
    }
    memset(ret, 0 , sizeof(xmlXPathContext));
    ret->doc = doc;
    ret->node = NULL;

    ret->varHash = NULL;

    ret->nb_types = 0;
    ret->max_types = 0;
    ret->types = NULL;

    ret->funcHash = xmlHashCreate(0);

    ret->nb_axis = 0;
    ret->max_axis = 0;
    ret->axis = NULL;

    ret->nsHash = NULL;
    ret->user = NULL;

    ret->contextSize = -1;
    ret->proximityPosition = -1;

#ifdef XP_DEFAULT_CACHE_ON
    if (xmlXPathContextSetCache(ret, 1, -1, 0) == -1) {
	xmlXPathFreeContext(ret);
	return(NULL);
    }
#endif

    xmlXPathRegisterAllFunctions(ret);

    return(ret);
}